

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingBuffer.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2057::RingBufferTest_Simple_Test::TestBody(RingBufferTest_Simple_Test *this)

{
  IndexT IVar1;
  long lVar2;
  char *pcVar3;
  char *in_R9;
  int i;
  int iVar4;
  AssertHelper local_b0;
  AssertHelper local_a8;
  AssertionResult gtest_ar_;
  Data_t v;
  AssertionResult gtest_ar;
  RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int> rb;
  uint TEST_SIZE;
  
  TEST_SIZE = 0x100;
  Sledge::RingBuffer<unsigned_short,_std::allocator<unsigned_short>,_int>::RingBuffer(&rb,0x100);
  for (iVar4 = 0; IVar1 = rb.length_, iVar4 != 0x100; iVar4 = iVar4 + 1) {
    if (rb.length_ != rb.bourn_) {
      lVar2 = (long)rb.tail_;
      rb.tail_ = rb.tail_ + 1;
      if (rb.bourn_ <= rb.tail_) {
        rb.tail_ = 0;
      }
      rb._data[lVar2] = (Data_t)iVar4;
      rb.length_ = rb.length_ + 1;
    }
    gtest_ar_.success_ = IVar1 != rb.bourn_;
    local_b0.data_._0_1_ = 1;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"rb.push(i)","true",&gtest_ar_.success_,(bool *)&local_b0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
                 ,0x49,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  gtest_ar_._0_4_ = rb.length_;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"rb.length()","TEST_SIZE",(int *)&gtest_ar_,&TEST_SIZE);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  IVar1 = rb.length_;
  if (rb.length_ != rb.bourn_) {
    rb._data[rb.tail_] = 0;
    iVar4 = rb.tail_ + 1;
    rb.tail_ = 0;
    if (iVar4 < rb.bourn_) {
      rb.tail_ = iVar4;
    }
    rb.length_ = rb.length_ + 1;
  }
  gtest_ar_.success_ = IVar1 != rb.bourn_;
  local_b0.data_._0_1_ = 0;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"rb.push(0)","false",&gtest_ar_.success_,(bool *)&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  for (local_a8.data_._0_4_ = 0; (uint)local_a8.data_ < 0x100;
      local_a8.data_._0_4_ = (uint)local_a8.data_ + 1) {
    IVar1 = rb.bourn_;
    if ((int)((uint)local_a8.data_ + rb.head_) < rb.bourn_) {
      IVar1 = 0;
    }
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)&gtest_ar,"rb[i]","i",
               rb._data + (int)(((uint)local_a8.data_ + rb.head_) - IVar1),(int *)&local_a8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
                 ,0x4d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  for (local_a8.data_._0_4_ = 0; (uint)local_a8.data_ < 0x100;
      local_a8.data_._0_4_ = (uint)local_a8.data_ + 1) {
    if (rb.length_ == 0) {
      v = 0;
    }
    else {
      lVar2 = (long)rb.head_;
      rb.head_ = rb.head_ + 1;
      if (rb.bourn_ <= rb.head_) {
        rb.head_ = 0;
      }
      v = rb._data[lVar2];
      rb.length_ = rb.length_ + -1;
    }
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)&gtest_ar,"v","i",&v,(int *)&local_a8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
                 ,0x50,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = rb.length_ == 0;
  if (rb.length_ != 0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"rb.isEmpty()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
               ,0x52,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  rb._vptr_RingBuffer = (_func_int **)&PTR__RingBuffer_0014a3f8;
  operator_delete(rb._data);
  return;
}

Assistant:

TEST( RingBufferTest,  Simple )
	{
		constexpr unsigned TEST_SIZE = 256;
		RingBuffer<uint16_t> rb(TEST_SIZE);
		for( int i=0; i<TEST_SIZE ; ++i )
			EXPECT_EQ( rb.push(i), true );
		EXPECT_EQ( rb.length(), TEST_SIZE);
		EXPECT_EQ( rb.push(0), false );  // buffer overflow. failed to push
		for( int i=0; i<TEST_SIZE ; ++i )
			EXPECT_EQ( rb[i], i );
		for( int i=0; i<TEST_SIZE ; ++i ) {
			auto v = rb.pop(); 
			EXPECT_EQ( v, i);
		}
		EXPECT_TRUE( rb.isEmpty() );
	}